

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSimpleUnaryExpr(CWriter *this,Opcode opcode,char *op)

{
  size_t size;
  Newline *args;
  char (*u) [3];
  Opcode local_78;
  StackVar local_74;
  Info local_68;
  
  local_78.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_68,&local_78);
  args = (Newline *)0x0;
  local_68.name._0_4_ = 0;
  local_68._4_8_ = local_68.result_type;
  local_74.index = 0;
  local_74.type.enum_ = Any;
  local_74.type.type_index_ = 0xffffffff;
  Write(this,(StackVar *)&local_68);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_74,u,args);
  DropTypes(this,1);
  Opcode::GetInfo(&local_68,&local_78);
  PushType(this,local_68.result_type);
  return;
}

Assistant:

void CWriter::WriteSimpleUnaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(0, result_type), " = ", op, "(", StackVar(0), ");", Newline());
  DropTypes(1);
  PushType(opcode.GetResultType());
}